

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O1

Expression * __thiscall
slang::ast::AssignmentExpression::fromComponents
          (AssignmentExpression *this,Compilation *compilation,
          optional<slang::ast::BinaryOperator> op,bitmask<slang::ast::AssignFlags> flags,
          Expression *lhs,Expression *rhs,SourceLocation assignLoc,TimingControl *timingControl,
          SourceRange sourceRange,ASTContext *context)

{
  Type *pTVar1;
  bool bVar2;
  AssignmentExpression *expr;
  Expression *pEVar3;
  BinaryExpression *this_00;
  Symbol *pSVar4;
  undefined4 in_register_0000000c;
  StreamingConcatenationExpression *lhs_00;
  DiagCode code;
  SourceRange SVar5;
  SourceLocation SVar6;
  bool local_3d;
  bitmask<slang::ast::AssignFlags> flags_local;
  optional<slang::ast::BinaryOperator> op_local;
  
  lhs_00 = (StreamingConcatenationExpression *)CONCAT44(in_register_0000000c,flags.m_bits);
  flags_local.m_bits =
       op.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
       super__Optional_payload_base<slang::ast::BinaryOperator>._M_payload;
  local_3d = (bool)(op.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
                    super__Optional_payload_base<slang::ast::BinaryOperator>._M_payload._0_1_ & 1);
  pTVar1 = (lhs_00->super_Expression).type.ptr;
  op_local.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::BinaryOperator> =
       (_Optional_base<slang::ast::BinaryOperator,_true,_true>)
       (_Optional_base<slang::ast::BinaryOperator,_true,_true>)compilation;
  if (pTVar1 != (Type *)0x0) {
    expr = BumpAllocator::
           emplace<slang::ast::AssignmentExpression,std::optional<slang::ast::BinaryOperator>&,bool,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::ast::TimingControl_const*&,slang::SourceRange&>
                     ((BumpAllocator *)this,&op_local,&local_3d,pTVar1,(Expression *)lhs_00,lhs,
                      (TimingControl **)&assignLoc,(SourceRange *)&timingControl);
    bVar2 = Expression::bad((Expression *)lhs_00);
    if ((!bVar2) && (bVar2 = Expression::bad(lhs), SVar6 = sourceRange.endLoc, !bVar2)) {
      if ((lhs_00->super_Expression).kind == Streaming) {
        bVar2 = Bitstream::canBeTarget
                          (lhs_00,lhs,(SourceLocation)rhs,(ASTContext *)sourceRange.endLoc);
        if ((bVar2) &&
           (bVar2 = Expression::requireLValue
                              ((Expression *)lhs_00,(ASTContext *)SVar6,(SourceLocation)rhs,
                               flags_local,(Expression *)0x0,(EvalContext *)0x0), bVar2)) {
          return &expr->super_Expression;
        }
      }
      else {
        if (op_local.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ast::BinaryOperator>._M_engaged == true) {
          pTVar1 = (lhs_00->super_Expression).type.ptr;
          if (pTVar1 == (Type *)0x0) goto LAB_0038f72a;
          SVar6 = (SourceLocation)0x38f615;
          this_00 = (BinaryExpression *)
                    BumpAllocator::
                    emplace<slang::ast::LValueReferenceExpression,slang::ast::Type_const&,slang::SourceRange&>
                              ((BumpAllocator *)this,pTVar1,&(lhs_00->super_Expression).sourceRange)
          ;
          SVar5.endLoc = SVar6;
          SVar5.startLoc = sourceRange.endLoc;
          pEVar3 = BinaryExpression::fromComponents
                             (this_00,expr->right_,
                              (Expression *)
                              ((ulong)op_local.
                                      super__Optional_base<slang::ast::BinaryOperator,_true,_true>.
                                      _M_payload.
                                      super__Optional_payload_base<slang::ast::BinaryOperator> &
                              0xffffffff),(BinaryOperator)rhs,(SourceLocation)timingControl,SVar5,
                              (ASTContext *)sourceRange.startLoc);
          expr->right_ = pEVar3;
        }
        SVar6 = sourceRange.endLoc;
        pTVar1 = (lhs_00->super_Expression).type.ptr;
        if (pTVar1 == (Type *)0x0) goto LAB_0038f72a;
        pEVar3 = Expression::convertAssignment
                           ((ASTContext *)sourceRange.endLoc,pTVar1,expr->right_,(SourceLocation)rhs
                            ,&expr->left_,&flags_local);
        expr->right_ = pEVar3;
        bVar2 = Expression::bad(pEVar3);
        if ((!bVar2) &&
           (bVar2 = Expression::requireLValue
                              (expr->left_,(ASTContext *)SVar6,(SourceLocation)rhs,flags_local,
                               (Expression *)0x0,(EvalContext *)0x0), bVar2)) {
          if (assignLoc == (SourceLocation)0x0) {
            return &expr->super_Expression;
          }
          pSVar4 = Expression::getSymbolReference((Expression *)lhs_00,true);
          if ((pSVar4 == (Symbol *)0x0) || (pSVar4->kind != ClockVar)) {
            if (*(int *)assignLoc != 8) {
              return &expr->super_Expression;
            }
            if (*(SyntaxNode **)((long)assignLoc + 8) == (SyntaxNode *)0x0) {
              assert::assertFailed
                        ("timingControl->syntax",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                         ,0x207,
                         "static Expression &slang::ast::AssignmentExpression::fromComponents(Compilation &, std::optional<BinaryOperator>, bitmask<AssignFlags>, Expression &, Expression &, SourceLocation, const TimingControl *, SourceRange, const ASTContext &)"
                        );
            }
            SVar5 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)((long)assignLoc + 8));
            code.subsystem = Expressions;
            code.code = 0x40;
          }
          else {
            if (*(int *)assignLoc == 8) {
              return &expr->super_Expression;
            }
            if (*(SyntaxNode **)((long)assignLoc + 8) == (SyntaxNode *)0x0) {
              assert::assertFailed
                        ("timingControl->syntax",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                         ,0x202,
                         "static Expression &slang::ast::AssignmentExpression::fromComponents(Compilation &, std::optional<BinaryOperator>, bitmask<AssignFlags>, Expression &, Expression &, SourceLocation, const TimingControl *, SourceRange, const ASTContext &)"
                        );
            }
            SVar5 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)((long)assignLoc + 8));
            code.subsystem = Expressions;
            code.code = 0x37;
          }
          ASTContext::addDiag((ASTContext *)SVar6,code,SVar5);
          return &expr->super_Expression;
        }
      }
    }
    pEVar3 = Expression::badExpr((Compilation *)this,&expr->super_Expression);
    return pEVar3;
  }
LAB_0038f72a:
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,
             "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
            );
}

Assistant:

Expression& AssignmentExpression::fromComponents(
    Compilation& compilation, std::optional<BinaryOperator> op, bitmask<AssignFlags> flags,
    Expression& lhs, Expression& rhs, SourceLocation assignLoc, const TimingControl* timingControl,
    SourceRange sourceRange, const ASTContext& context) {

    auto result = compilation.emplace<AssignmentExpression>(op, flags.has(AssignFlags::NonBlocking),
                                                            *lhs.type, lhs, rhs, timingControl,
                                                            sourceRange);

    if (lhs.bad() || rhs.bad())
        return badExpr(compilation, result);

    if (lhs.kind == ExpressionKind::Streaming) {
        if (!Bitstream::canBeTarget(lhs.as<StreamingConcatenationExpression>(), rhs, assignLoc,
                                    context)) {
            return badExpr(compilation, result);
        }

        if (!lhs.requireLValue(context, assignLoc, flags))
            return badExpr(compilation, result);

        return *result;
    }

    // If this is a compound assignment operator create a binary expression that will
    // apply the operator for us on the right hand side.
    if (op) {
        auto lvalRef = compilation.emplace<LValueReferenceExpression>(*lhs.type, lhs.sourceRange);
        result->right_ = &BinaryExpression::fromComponents(*lvalRef, *result->right_, *op,
                                                           assignLoc, sourceRange, context);
    }

    result->right_ = &convertAssignment(context, *lhs.type, *result->right_, assignLoc,
                                        &result->left_, &flags);
    if (result->right_->bad())
        return badExpr(compilation, result);

    if (!result->left_->requireLValue(context, assignLoc, flags))
        return badExpr(compilation, result);

    if (timingControl) {
        // Cycle delays are only allowed on clock vars, and clock vars
        // cannot use any timing control other than cycle delays.
        if (auto sym = lhs.getSymbolReference(); sym && sym->kind == SymbolKind::ClockVar) {
            if (timingControl->kind != TimingControlKind::CycleDelay) {
                ASSERT(timingControl->syntax);
                context.addDiag(diag::ClockVarBadTiming, timingControl->syntax->sourceRange());
            }
        }
        else if (timingControl->kind == TimingControlKind::CycleDelay) {
            ASSERT(timingControl->syntax);
            context.addDiag(diag::CycleDelayNonClock, timingControl->syntax->sourceRange());
        }
    }

    return *result;
}